

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O1

void __thiscall Patch::Node::serialize(Node *this,Serializer *output)

{
  uchar uVar1;
  int iVar2;
  uint uVar3;
  uchar local_2d [3];
  uchar local_2a [2];
  
  Point::serialize(&this->old_extent,output);
  Point::serialize(&this->new_extent,output);
  Point::serialize(&this->old_distance_from_left_ancestor,output);
  Point::serialize(&this->new_distance_from_left_ancestor,output);
  if ((this->old_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
      super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
      super__Head_base<0UL,_Text_*,_false>._M_head_impl == (Text *)0x0) {
    iVar2 = 4;
    do {
      local_2d[1] = 0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (*(vector<unsigned_char,_std::allocator<unsigned_char>_> **)output,local_2d + 1);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
    uVar3 = this->old_text_size_;
    iVar2 = 4;
    do {
      local_2d[2] = (uchar)uVar3;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (*(vector<unsigned_char,_std::allocator<unsigned_char>_> **)output,local_2d + 2);
      uVar3 = uVar3 >> 8;
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  else {
    uVar1 = '\x01';
    iVar2 = 4;
    do {
      local_2d[0] = uVar1;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (*(vector<unsigned_char,_std::allocator<unsigned_char>_> **)output,local_2d);
      uVar1 = '\0';
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
    Text::serialize((this->old_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>.
                    _M_t.super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
                    super__Head_base<0UL,_Text_*,_false>._M_head_impl,output);
  }
  if ((this->new_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>._M_t.
      super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
      super__Head_base<0UL,_Text_*,_false>._M_head_impl == (Text *)0x0) {
    iVar2 = 4;
    do {
      local_2a[1] = 0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (*(vector<unsigned_char,_std::allocator<unsigned_char>_> **)output,local_2a + 1);
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
  }
  else {
    uVar1 = '\x01';
    iVar2 = 4;
    do {
      local_2a[0] = uVar1;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                (*(vector<unsigned_char,_std::allocator<unsigned_char>_> **)output,local_2a);
      uVar1 = '\0';
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
    Text::serialize((this->new_text)._M_t.super___uniq_ptr_impl<Text,_std::default_delete<Text>_>.
                    _M_t.super__Tuple_impl<0UL,_Text_*,_std::default_delete<Text>_>.
                    super__Head_base<0UL,_Text_*,_false>._M_head_impl,output);
  }
  return;
}

Assistant:

void serialize(Serializer &output) const {
    old_extent.serialize(output);
    new_extent.serialize(output);
    old_distance_from_left_ancestor.serialize(output);
    new_distance_from_left_ancestor.serialize(output);
    if (old_text) {
      output.append<uint32_t>(1);
      old_text->serialize(output);
    } else {
      output.append<uint32_t>(0);
      output.append<uint32_t>(old_text_size_);
    }
    if (new_text) {
      output.append<uint32_t>(1);
      new_text->serialize(output);
    } else {
      output.append<uint32_t>(0);
    }
  }